

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsgdotspec(prscxdef *ctx,prsndef *n)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  prsndef *n_00;
  emtcxdef *peVar4;
  uint16_t tmp;
  
  n_00 = (n->prsnv).prsnvn[1];
  prsgexp(ctx,(n->prsnv).prsnvn[0]);
  if ((n_00->prsnnlf == 0) && ((n_00->prsnv).prsnvt.toktyp == 0x55)) {
    uVar2 = (n_00->prsnv).prsnvt.tokofs;
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar3 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar3 + 1;
    peVar4->emtcxptr[uVar3] = '\x13';
    emtres(ctx->prscxemt,2);
    *(ushort *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = uVar2;
    puVar1 = &ctx->prscxemt->emtcxofs;
    *puVar1 = *puVar1 + 2;
  }
  else {
    prsgexp(ctx,n_00);
    emtres(ctx->prscxemt,1);
    peVar4 = ctx->prscxemt;
    uVar3 = peVar4->emtcxofs;
    peVar4->emtcxofs = uVar3 + 1;
    peVar4->emtcxptr[uVar3] = '\x15';
  }
  return;
}

Assistant:

static void prsgdotspec(prscxdef *ctx, prsndef *n)
{
    prsndef *n0 = n->prsnv.prsnvn[0];
    prsndef *n1 = n->prsnv.prsnvn[1];

    /* push object whose property we're getting */
    prsgexp(ctx, n0);

    if (n1->prsnnlf == 0
        && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
    {
        /* RHS is a property symbol - do a simple GETP (or INHERIT) */
        prpnum prop = n1->prsnv.prsnvt.tokofs;

        /* push the data property */
        emtop(ctx->prscxemt, OPCGETPDATA);
        emtint2(ctx->prscxemt, prop);
    }
    else
    {
        /* RHS is an expression - evaluate it */
        prsgexp(ctx, n1);

        /* get the data property */
        emtop(ctx->prscxemt, OPCPTRGETPDATA);
    }
}